

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Info * __thiscall V2Transport::GetInfo(V2Transport *this)

{
  long lVar1;
  Span<const_unsigned_char> vch;
  BIP324Cipher *this_00;
  char *in_RSI;
  undefined1 *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> SVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock56;
  V1Transport *in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined4 uVar3;
  int nLine;
  char *in_stack_ffffffffffffff98;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  uVar3 = SUB84(in_RDI,0);
  nLine = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(Mutex *)0x20cab4);
  this_00 = (BIP324Cipher *)MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0
             ,in_stack_ffffffffffffff98,in_RSI,nLine,SUB41((uint)uVar3 >> 0x18,0));
  if (in_RSI[0x518] == '\x06') {
    V1Transport::GetInfo(in_stack_ffffffffffffff68);
    SVar2.m_size = (size_t)in_stack_ffffffffffffff68;
    SVar2.m_data = in_stack_ffffffffffffff70;
  }
  else {
    Transport::Info::Info((Info *)in_stack_ffffffffffffff68);
    SVar2.m_size = (size_t)in_stack_ffffffffffffff68;
    SVar2.m_data = in_stack_ffffffffffffff70;
    if ((((in_RSI[0x518] == '\0') || (in_RSI[0x518] == '\x01')) || (in_RSI[0x518] == '\x02')) ||
       (in_RSI[0x518] == '\x03')) {
      *in_RDI = 0;
    }
    else {
      *in_RDI = 2;
      BIP324Cipher::GetSessionID(this_00);
      SVar2 = MakeUCharSpan<Span<std::byte_const>>((Span<const_std::byte> *)this_00);
      vch.m_size._0_4_ = uVar3;
      vch.m_data = in_RDI;
      vch.m_size._4_4_ = nLine;
      uint256::uint256((uint256 *)SVar2.m_size,vch);
      std::optional<uint256>::operator=((optional<uint256> *)this_00,(uint256 *)SVar2.m_data);
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)SVar2.m_size);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Info *)CONCAT44(nLine,uVar3);
}

Assistant:

Transport::Info V2Transport::GetInfo() const noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.GetInfo();

    Transport::Info info;

    // Do not report v2 and session ID until the version packet has been received
    // and verified (confirming that the other side very likely has the same keys as us).
    if (m_recv_state != RecvState::KEY_MAYBE_V1 && m_recv_state != RecvState::KEY &&
        m_recv_state != RecvState::GARB_GARBTERM && m_recv_state != RecvState::VERSION) {
        info.transport_type = TransportProtocolType::V2;
        info.session_id = uint256(MakeUCharSpan(m_cipher.GetSessionID()));
    } else {
        info.transport_type = TransportProtocolType::DETECTING;
    }

    return info;
}